

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O1

void test_decimal128_from_string__invalid_inputs(void)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  bson_decimal128_t dec;
  char cStack_2e0;
  char cStack_2df;
  char cStack_2de;
  char cStack_2dd;
  char cStack_2dc;
  char cStack_2db;
  char cStack_2da;
  char cStack_2d9;
  char cStack_2d8;
  char cStack_2d7;
  char cStack_2d6;
  char cStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  char cStack_2d1;
  char cStack_2d0;
  char cStack_2cf;
  char cStack_2ce;
  char cStack_2cd;
  char cStack_2cc;
  char cStack_2cb;
  char cStack_2ca;
  char cStack_2c9;
  char cStack_2c8;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  char cStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  char cStack_2b9;
  char cStack_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char cStack_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  code *pcStack_2a0;
  undefined8 uStack_290;
  undefined8 uStack_288;
  char cStack_280;
  char cStack_27f;
  char cStack_27e;
  char cStack_27d;
  char cStack_27c;
  char cStack_27b;
  char cStack_27a;
  char cStack_279;
  char cStack_278;
  char cStack_277;
  char cStack_276;
  char cStack_275;
  char cStack_274;
  char cStack_273;
  char cStack_272;
  char cStack_271;
  char cStack_270;
  char cStack_26f;
  char cStack_26e;
  char cStack_26d;
  char cStack_26c;
  char cStack_26b;
  char cStack_26a;
  char cStack_269;
  char cStack_268;
  char cStack_267;
  char cStack_266;
  char cStack_265;
  char cStack_264;
  char cStack_263;
  char cStack_262;
  char cStack_261;
  char cStack_260;
  char cStack_25f;
  char cStack_25e;
  char cStack_25d;
  char cStack_25c;
  char cStack_25b;
  char cStack_25a;
  char cStack_259;
  char cStack_258;
  char cStack_257;
  char cStack_256;
  char cStack_255;
  char cStack_254;
  char cStack_253;
  char cStack_252;
  char cStack_251;
  char cStack_250;
  char cStack_24f;
  char cStack_24e;
  char cStack_24d;
  char cStack_24c;
  char cStack_24b;
  char cStack_24a;
  char cStack_249;
  char cStack_248;
  char cStack_247;
  char cStack_246;
  char cStack_245;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char *pcStack_240;
  code *pcStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char cStack_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  char cStack_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char cStack_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char cStack_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  char cStack_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  char cStack_1d1;
  code *pcStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  char cStack_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  undefined1 auStack_1a8 [16];
  undefined1 auStack_198 [16];
  char cStack_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  char cStack_178;
  char cStack_177;
  char cStack_176;
  char cStack_175;
  char cStack_174;
  char cStack_173;
  char cStack_172;
  char cStack_171;
  char cStack_170;
  char cStack_16f;
  char cStack_16e;
  char cStack_16d;
  char cStack_16c;
  char cStack_16b;
  char cStack_16a;
  char cStack_169;
  char cStack_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  char cStack_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  char cStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  char cStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  char cStack_149;
  code *pcStack_148;
  undefined8 uStack_138;
  undefined8 uStack_130;
  char cStack_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  char cStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  char cStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  char cStack_119;
  char cStack_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char cStack_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char cStack_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  char cStack_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  char cStack_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  char cStack_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char cStack_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char cStack_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char cStack_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  undefined1 *puStack_88;
  code *pcStack_80;
  undefined1 auStack_70 [8];
  long lStack_68;
  undefined1 *puStack_60;
  code *pcStack_58;
  undefined1 auStack_48 [8];
  long lStack_40;
  undefined1 *puStack_38;
  code *pcStack_30;
  undefined1 local_20 [8];
  long local_18;
  
  pcStack_30 = (code *)0x1282c0;
  bson_decimal128_from_string(".",local_20);
  if (local_18 == 0x7c00000000000000) {
    pcStack_30 = (code *)0x1282de;
    bson_decimal128_from_string(".e",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128451;
    pcStack_30 = (code *)0x1282fc;
    bson_decimal128_from_string("",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128456;
    pcStack_30 = (code *)0x12831a;
    bson_decimal128_from_string("invalid",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_0012845b;
    pcStack_30 = (code *)0x128338;
    bson_decimal128_from_string("in",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128460;
    pcStack_30 = (code *)0x128356;
    bson_decimal128_from_string("i",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128465;
    pcStack_30 = (code *)0x128374;
    bson_decimal128_from_string("E02",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_0012846a;
    pcStack_30 = (code *)0x128392;
    bson_decimal128_from_string("..1",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_0012846f;
    pcStack_30 = (code *)0x1283b0;
    bson_decimal128_from_string("1abcede",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128474;
    pcStack_30 = (code *)0x1283ce;
    bson_decimal128_from_string("1.24abc",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128479;
    pcStack_30 = (code *)0x1283ec;
    bson_decimal128_from_string("1.24abcE+02",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_0012847e;
    pcStack_30 = (code *)0x12840a;
    bson_decimal128_from_string("1.24E+02abc2d",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128483;
    pcStack_30 = (code *)0x128424;
    bson_decimal128_from_string("E+02",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_00128488;
    pcStack_30 = (code *)0x12843e;
    bson_decimal128_from_string("e+02",local_20);
    if (local_18 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_30 = (code *)0x128451;
    test_decimal128_from_string__invalid_inputs_cold_1();
LAB_00128451:
    pcStack_30 = (code *)0x128456;
    test_decimal128_from_string__invalid_inputs_cold_2();
LAB_00128456:
    pcStack_30 = (code *)0x12845b;
    test_decimal128_from_string__invalid_inputs_cold_3();
LAB_0012845b:
    pcStack_30 = (code *)0x128460;
    test_decimal128_from_string__invalid_inputs_cold_4();
LAB_00128460:
    pcStack_30 = (code *)0x128465;
    test_decimal128_from_string__invalid_inputs_cold_5();
LAB_00128465:
    pcStack_30 = (code *)0x12846a;
    test_decimal128_from_string__invalid_inputs_cold_6();
LAB_0012846a:
    pcStack_30 = (code *)0x12846f;
    test_decimal128_from_string__invalid_inputs_cold_7();
LAB_0012846f:
    pcStack_30 = (code *)0x128474;
    test_decimal128_from_string__invalid_inputs_cold_8();
LAB_00128474:
    pcStack_30 = (code *)0x128479;
    test_decimal128_from_string__invalid_inputs_cold_9();
LAB_00128479:
    pcStack_30 = (code *)0x12847e;
    test_decimal128_from_string__invalid_inputs_cold_10();
LAB_0012847e:
    pcStack_30 = (code *)0x128483;
    test_decimal128_from_string__invalid_inputs_cold_11();
LAB_00128483:
    pcStack_30 = (code *)0x128488;
    test_decimal128_from_string__invalid_inputs_cold_12();
LAB_00128488:
    pcStack_30 = (code *)0x12848d;
    test_decimal128_from_string__invalid_inputs_cold_13();
  }
  pcStack_30 = test_decimal128_from_string__nan;
  test_decimal128_from_string__invalid_inputs_cold_14();
  pcStack_30 = (code *)0x7c00000000000000;
  pcStack_58 = (code *)0x1284b7;
  puStack_38 = local_20;
  bson_decimal128_from_string("NaN",auStack_48);
  if (lStack_40 == 0x7c00000000000000) {
    pcStack_58 = (code *)0x1284d5;
    bson_decimal128_from_string("+NaN",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285cc;
    pcStack_58 = (code *)0x1284f3;
    bson_decimal128_from_string("-NaN",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285d1;
    pcStack_58 = (code *)0x128511;
    bson_decimal128_from_string("-nan",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285d6;
    pcStack_58 = (code *)0x12852f;
    bson_decimal128_from_string("1e",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285db;
    pcStack_58 = (code *)0x12854d;
    bson_decimal128_from_string("+nan",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285e0;
    pcStack_58 = (code *)0x12856b;
    bson_decimal128_from_string("nan",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285e5;
    pcStack_58 = (code *)0x128585;
    bson_decimal128_from_string("Nan",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285ea;
    pcStack_58 = (code *)0x12859f;
    bson_decimal128_from_string("+Nan",auStack_48);
    if (lStack_40 != 0x7c00000000000000) goto LAB_001285ef;
    pcStack_58 = (code *)0x1285b9;
    bson_decimal128_from_string("-Nan",auStack_48);
    if (lStack_40 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_58 = (code *)0x1285cc;
    test_decimal128_from_string__nan_cold_1();
LAB_001285cc:
    pcStack_58 = (code *)0x1285d1;
    test_decimal128_from_string__nan_cold_2();
LAB_001285d1:
    pcStack_58 = (code *)0x1285d6;
    test_decimal128_from_string__nan_cold_3();
LAB_001285d6:
    pcStack_58 = (code *)0x1285db;
    test_decimal128_from_string__nan_cold_4();
LAB_001285db:
    pcStack_58 = (code *)0x1285e0;
    test_decimal128_from_string__nan_cold_5();
LAB_001285e0:
    pcStack_58 = (code *)0x1285e5;
    test_decimal128_from_string__nan_cold_6();
LAB_001285e5:
    pcStack_58 = (code *)0x1285ea;
    test_decimal128_from_string__nan_cold_7();
LAB_001285ea:
    pcStack_58 = (code *)0x1285ef;
    test_decimal128_from_string__nan_cold_8();
LAB_001285ef:
    pcStack_58 = (code *)0x1285f4;
    test_decimal128_from_string__nan_cold_9();
  }
  pcStack_58 = test_decimal128_from_string__infinity;
  test_decimal128_from_string__nan_cold_10();
  pcStack_58 = (code *)0x7c00000000000000;
  uVar2 = 0x7800000000000000;
  pcStack_80 = (code *)0x12861e;
  puStack_60 = auStack_48;
  bson_decimal128_from_string("Infinity",auStack_70);
  if (lStack_68 == 0x7800000000000000) {
    pcStack_80 = (code *)0x128638;
    bson_decimal128_from_string("+Infinity",auStack_70);
    if (lStack_68 != 0x7800000000000000) goto LAB_001286a3;
    pcStack_80 = (code *)0x128652;
    bson_decimal128_from_string("+Inf",auStack_70);
    if (lStack_68 != 0x7800000000000000) goto LAB_001286a8;
    uVar2 = 0xf800000000000000;
    pcStack_80 = (code *)0x128676;
    bson_decimal128_from_string("-Inf",auStack_70);
    if (lStack_68 != -0x800000000000000) goto LAB_001286ad;
    pcStack_80 = (code *)0x128690;
    bson_decimal128_from_string("-Infinity",auStack_70);
    if (lStack_68 == -0x800000000000000) {
      return;
    }
  }
  else {
    pcStack_80 = (code *)0x1286a3;
    test_decimal128_from_string__infinity_cold_1();
LAB_001286a3:
    pcStack_80 = (code *)0x1286a8;
    test_decimal128_from_string__infinity_cold_2();
LAB_001286a8:
    pcStack_80 = (code *)0x1286ad;
    test_decimal128_from_string__infinity_cold_3();
LAB_001286ad:
    pcStack_80 = (code *)0x1286b2;
    test_decimal128_from_string__infinity_cold_4();
  }
  pcStack_80 = test_decimal128_from_string__simple;
  test_decimal128_from_string__infinity_cold_5();
  pcStack_148 = (code *)0x1286e2;
  puStack_88 = auStack_70;
  pcStack_80 = (code *)uVar2;
  bson_decimal128_from_string("1",&cStack_98);
  pcStack_148 = (code *)0x1286f6;
  bson_decimal128_from_string("-1",&cStack_a8);
  pcStack_148 = (code *)0x12870a;
  bson_decimal128_from_string("0",&cStack_b8);
  pcStack_148 = (code *)0x12871b;
  bson_decimal128_from_string("-0",&cStack_c8);
  pcStack_148 = (code *)0x12872c;
  bson_decimal128_from_string("12345678901234567",&cStack_d8);
  pcStack_148 = (code *)0x12873d;
  bson_decimal128_from_string("989898983458",&cStack_e8);
  pcStack_148 = (code *)0x12874e;
  bson_decimal128_from_string("-12345678901234567",&cStack_f8);
  pcStack_148 = (code *)0x12875f;
  bson_decimal128_from_string("0.12345",&cStack_108);
  pcStack_148 = (code *)0x128770;
  bson_decimal128_from_string("0.0012345",&cStack_118);
  pcStack_148 = (code *)0x128781;
  bson_decimal128_from_string("00012345678901234567",&cStack_128);
  uStack_130 = 0x3040000000000000;
  uStack_138 = 1;
  auVar3[0] = -(cStack_98 == '\x01');
  auVar3[1] = -(cStack_97 == '\0');
  auVar3[2] = -(cStack_96 == '\0');
  auVar3[3] = -(cStack_95 == '\0');
  auVar3[4] = -(cStack_94 == '\0');
  auVar3[5] = -(cStack_93 == '\0');
  auVar3[6] = -(cStack_92 == '\0');
  auVar3[7] = -(cStack_91 == '\0');
  auVar3[8] = -(cStack_90 == '\0');
  auVar3[9] = -(cStack_8f == '\0');
  auVar3[10] = -(cStack_8e == '\0');
  auVar3[0xb] = -(cStack_8d == '\0');
  auVar3[0xc] = -(cStack_8c == '\0');
  auVar3[0xd] = -(cStack_8b == '\0');
  auVar3[0xe] = -(cStack_8a == '@');
  auVar3[0xf] = -(cStack_89 == '0');
  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf) ==
      0xffff) {
    uStack_130 = 0xb040000000000000;
    uStack_138 = 1;
    auVar4[0] = -(cStack_a8 == '\x01');
    auVar4[1] = -(cStack_a7 == '\0');
    auVar4[2] = -(cStack_a6 == '\0');
    auVar4[3] = -(cStack_a5 == '\0');
    auVar4[4] = -(cStack_a4 == '\0');
    auVar4[5] = -(cStack_a3 == '\0');
    auVar4[6] = -(cStack_a2 == '\0');
    auVar4[7] = -(cStack_a1 == '\0');
    auVar4[8] = -(cStack_a0 == '\0');
    auVar4[9] = -(cStack_9f == '\0');
    auVar4[10] = -(cStack_9e == '\0');
    auVar4[0xb] = -(cStack_9d == '\0');
    auVar4[0xc] = -(cStack_9c == '\0');
    auVar4[0xd] = -(cStack_9b == '\0');
    auVar4[0xe] = -(cStack_9a == '@');
    auVar4[0xf] = -(cStack_99 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128976;
    uStack_130 = 0x3040000000000000;
    uStack_138 = 0;
    auVar5[0] = -(cStack_b8 == '\0');
    auVar5[1] = -(cStack_b7 == '\0');
    auVar5[2] = -(cStack_b6 == '\0');
    auVar5[3] = -(cStack_b5 == '\0');
    auVar5[4] = -(cStack_b4 == '\0');
    auVar5[5] = -(cStack_b3 == '\0');
    auVar5[6] = -(cStack_b2 == '\0');
    auVar5[7] = -(cStack_b1 == '\0');
    auVar5[8] = -(cStack_b0 == '\0');
    auVar5[9] = -(cStack_af == '\0');
    auVar5[10] = -(cStack_ae == '\0');
    auVar5[0xb] = -(cStack_ad == '\0');
    auVar5[0xc] = -(cStack_ac == '\0');
    auVar5[0xd] = -(cStack_ab == '\0');
    auVar5[0xe] = -(cStack_aa == '@');
    auVar5[0xf] = -(cStack_a9 == '0');
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012897b;
    uStack_130 = 0xb040000000000000;
    uStack_138 = 0;
    auVar6[0] = -(cStack_c8 == '\0');
    auVar6[1] = -(cStack_c7 == '\0');
    auVar6[2] = -(cStack_c6 == '\0');
    auVar6[3] = -(cStack_c5 == '\0');
    auVar6[4] = -(cStack_c4 == '\0');
    auVar6[5] = -(cStack_c3 == '\0');
    auVar6[6] = -(cStack_c2 == '\0');
    auVar6[7] = -(cStack_c1 == '\0');
    auVar6[8] = -(cStack_c0 == '\0');
    auVar6[9] = -(cStack_bf == '\0');
    auVar6[10] = -(cStack_be == '\0');
    auVar6[0xb] = -(cStack_bd == '\0');
    auVar6[0xc] = -(cStack_bc == '\0');
    auVar6[0xd] = -(cStack_bb == '\0');
    auVar6[0xe] = -(cStack_ba == '@');
    auVar6[0xf] = -(cStack_b9 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128980;
    uStack_130 = 0x3040000000000000;
    uStack_138 = 0x2bdc545d6b4b87;
    auVar7[0] = -(cStack_d8 == -0x79);
    auVar7[1] = -(cStack_d7 == 'K');
    auVar7[2] = -(cStack_d6 == 'k');
    auVar7[3] = -(cStack_d5 == ']');
    auVar7[4] = -(cStack_d4 == 'T');
    auVar7[5] = -(cStack_d3 == -0x24);
    auVar7[6] = -(cStack_d2 == '+');
    auVar7[7] = -(cStack_d1 == '\0');
    auVar7[8] = -(cStack_d0 == '\0');
    auVar7[9] = -(cStack_cf == '\0');
    auVar7[10] = -(cStack_ce == '\0');
    auVar7[0xb] = -(cStack_cd == '\0');
    auVar7[0xc] = -(cStack_cc == '\0');
    auVar7[0xd] = -(cStack_cb == '\0');
    auVar7[0xe] = -(cStack_ca == '@');
    auVar7[0xf] = -(cStack_c9 == '0');
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128985;
    uStack_130 = 0x3040000000000000;
    uStack_138 = 0xe67a93c822;
    auVar8[0] = -(cStack_e8 == '\"');
    auVar8[1] = -(cStack_e7 == -0x38);
    auVar8[2] = -(cStack_e6 == -0x6d);
    auVar8[3] = -(cStack_e5 == 'z');
    auVar8[4] = -(cStack_e4 == -0x1a);
    auVar8[5] = -(cStack_e3 == '\0');
    auVar8[6] = -(cStack_e2 == '\0');
    auVar8[7] = -(cStack_e1 == '\0');
    auVar8[8] = -(cStack_e0 == '\0');
    auVar8[9] = -(cStack_df == '\0');
    auVar8[10] = -(cStack_de == '\0');
    auVar8[0xb] = -(cStack_dd == '\0');
    auVar8[0xc] = -(cStack_dc == '\0');
    auVar8[0xd] = -(cStack_db == '\0');
    auVar8[0xe] = -(cStack_da == '@');
    auVar8[0xf] = -(cStack_d9 == '0');
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012898a;
    uStack_130 = 0xb040000000000000;
    uStack_138 = 0x2bdc545d6b4b87;
    auVar9[0] = -(cStack_f8 == -0x79);
    auVar9[1] = -(cStack_f7 == 'K');
    auVar9[2] = -(cStack_f6 == 'k');
    auVar9[3] = -(cStack_f5 == ']');
    auVar9[4] = -(cStack_f4 == 'T');
    auVar9[5] = -(cStack_f3 == -0x24);
    auVar9[6] = -(cStack_f2 == '+');
    auVar9[7] = -(cStack_f1 == '\0');
    auVar9[8] = -(cStack_f0 == '\0');
    auVar9[9] = -(cStack_ef == '\0');
    auVar9[10] = -(cStack_ee == '\0');
    auVar9[0xb] = -(cStack_ed == '\0');
    auVar9[0xc] = -(cStack_ec == '\0');
    auVar9[0xd] = -(cStack_eb == '\0');
    auVar9[0xe] = -(cStack_ea == '@');
    auVar9[0xf] = -(cStack_e9 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012898f;
    uStack_130 = 0x3036000000000000;
    uStack_138 = 0x3039;
    auVar10[0] = -(cStack_108 == '9');
    auVar10[1] = -(cStack_107 == '0');
    auVar10[2] = -(cStack_106 == '\0');
    auVar10[3] = -(cStack_105 == '\0');
    auVar10[4] = -(cStack_104 == '\0');
    auVar10[5] = -(cStack_103 == '\0');
    auVar10[6] = -(cStack_102 == '\0');
    auVar10[7] = -(cStack_101 == '\0');
    auVar10[8] = -(cStack_100 == '\0');
    auVar10[9] = -(cStack_ff == '\0');
    auVar10[10] = -(cStack_fe == '\0');
    auVar10[0xb] = -(cStack_fd == '\0');
    auVar10[0xc] = -(cStack_fc == '\0');
    auVar10[0xd] = -(cStack_fb == '\0');
    auVar10[0xe] = -(cStack_fa == '6');
    auVar10[0xf] = -(cStack_f9 == '0');
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128994;
    uStack_130 = 0x3032000000000000;
    uStack_138 = 0x3039;
    auVar11[0] = -(cStack_118 == '9');
    auVar11[1] = -(cStack_117 == '0');
    auVar11[2] = -(cStack_116 == '\0');
    auVar11[3] = -(cStack_115 == '\0');
    auVar11[4] = -(cStack_114 == '\0');
    auVar11[5] = -(cStack_113 == '\0');
    auVar11[6] = -(cStack_112 == '\0');
    auVar11[7] = -(cStack_111 == '\0');
    auVar11[8] = -(cStack_110 == '\0');
    auVar11[9] = -(cStack_10f == '\0');
    auVar11[10] = -(cStack_10e == '\0');
    auVar11[0xb] = -(cStack_10d == '\0');
    auVar11[0xc] = -(cStack_10c == '\0');
    auVar11[0xd] = -(cStack_10b == '\0');
    auVar11[0xe] = -(cStack_10a == '2');
    auVar11[0xf] = -(cStack_109 == '0');
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128999;
    uStack_130 = 0x3040000000000000;
    uStack_138 = 0x2bdc545d6b4b87;
    auVar12[0] = -(cStack_128 == -0x79);
    auVar12[1] = -(cStack_127 == 'K');
    auVar12[2] = -(cStack_126 == 'k');
    auVar12[3] = -(cStack_125 == ']');
    auVar12[4] = -(cStack_124 == 'T');
    auVar12[5] = -(cStack_123 == -0x24);
    auVar12[6] = -(cStack_122 == '+');
    auVar12[7] = -(cStack_121 == '\0');
    auVar12[8] = -(cStack_120 == '\0');
    auVar12[9] = -(cStack_11f == '\0');
    auVar12[10] = -(cStack_11e == '\0');
    auVar12[0xb] = -(cStack_11d == '\0');
    auVar12[0xc] = -(cStack_11c == '\0');
    auVar12[0xd] = -(cStack_11b == '\0');
    auVar12[0xe] = -(cStack_11a == '@');
    auVar12[0xf] = -(cStack_119 == '0');
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_148 = (code *)0x128976;
    test_decimal128_from_string__simple_cold_1();
LAB_00128976:
    pcStack_148 = (code *)0x12897b;
    test_decimal128_from_string__simple_cold_2();
LAB_0012897b:
    pcStack_148 = (code *)0x128980;
    test_decimal128_from_string__simple_cold_3();
LAB_00128980:
    pcStack_148 = (code *)0x128985;
    test_decimal128_from_string__simple_cold_4();
LAB_00128985:
    pcStack_148 = (code *)0x12898a;
    test_decimal128_from_string__simple_cold_5();
LAB_0012898a:
    pcStack_148 = (code *)0x12898f;
    test_decimal128_from_string__simple_cold_6();
LAB_0012898f:
    pcStack_148 = (code *)0x128994;
    test_decimal128_from_string__simple_cold_7();
LAB_00128994:
    pcStack_148 = (code *)0x128999;
    test_decimal128_from_string__simple_cold_8();
LAB_00128999:
    pcStack_148 = (code *)0x12899e;
    test_decimal128_from_string__simple_cold_9();
  }
  pcStack_148 = test_decimal128_from_string__scientific;
  test_decimal128_from_string__simple_cold_10();
  pcVar1 = &cStack_158;
  pcStack_1d0 = (code *)0x1289bf;
  pcStack_148 = (code *)&cStack_98;
  bson_decimal128_from_string("10e0",pcVar1);
  pcStack_1d0 = (code *)0x1289d0;
  bson_decimal128_from_string("1e1",&cStack_188);
  pcStack_1d0 = (code *)0x1289e1;
  bson_decimal128_from_string("10e-1",auStack_198);
  uStack_1c0 = 0x3040000000000000;
  uStack_1c8 = 10;
  auVar13[0] = -(cStack_158 == '\n');
  auVar13[1] = -(cStack_157 == '\0');
  auVar13[2] = -(cStack_156 == '\0');
  auVar13[3] = -(cStack_155 == '\0');
  auVar13[4] = -(cStack_154 == '\0');
  auVar13[5] = -(cStack_153 == '\0');
  auVar13[6] = -(cStack_152 == '\0');
  auVar13[7] = -(cStack_151 == '\0');
  auVar13[8] = -(cStack_150 == '\0');
  auVar13[9] = -(cStack_14f == '\0');
  auVar13[10] = -(cStack_14e == '\0');
  auVar13[0xb] = -(cStack_14d == '\0');
  auVar13[0xc] = -(cStack_14c == '\0');
  auVar13[0xd] = -(cStack_14b == '\0');
  auVar13[0xe] = -(cStack_14a == '@');
  auVar13[0xf] = -(cStack_149 == '0');
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_1c0 = 0x3042000000000000;
    uStack_1c8 = 1;
    auVar14[0] = -(cStack_188 == '\x01');
    auVar14[1] = -(cStack_187 == '\0');
    auVar14[2] = -(cStack_186 == '\0');
    auVar14[3] = -(cStack_185 == '\0');
    auVar14[4] = -(cStack_184 == '\0');
    auVar14[5] = -(cStack_183 == '\0');
    auVar14[6] = -(cStack_182 == '\0');
    auVar14[7] = -(cStack_181 == '\0');
    auVar14[8] = -(cStack_180 == '\0');
    auVar14[9] = -(cStack_17f == '\0');
    auVar14[10] = -(cStack_17e == '\0');
    auVar14[0xb] = -(cStack_17d == '\0');
    auVar14[0xc] = -(cStack_17c == '\0');
    auVar14[0xd] = -(cStack_17b == '\0');
    auVar14[0xe] = -(cStack_17a == 'B');
    auVar14[0xf] = -(cStack_179 == '0');
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128b9e;
    uStack_1c0 = 0x303e000000000000;
    uStack_1c8 = 10;
    auVar15[0] = -(auStack_198[0] == '\n');
    auVar15[1] = -(auStack_198[1] == '\0');
    auVar15[2] = -(auStack_198[2] == '\0');
    auVar15[3] = -(auStack_198[3] == '\0');
    auVar15[4] = -(auStack_198[4] == '\0');
    auVar15[5] = -(auStack_198[5] == '\0');
    auVar15[6] = -(auStack_198[6] == '\0');
    auVar15[7] = -(auStack_198[7] == '\0');
    auVar15[8] = -(auStack_198[8] == '\0');
    auVar15[9] = -(auStack_198[9] == '\0');
    auVar15[10] = -(auStack_198[10] == '\0');
    auVar15[0xb] = -(auStack_198[0xb] == '\0');
    auVar15[0xc] = -(auStack_198[0xc] == '\0');
    auVar15[0xd] = -(auStack_198[0xd] == '\0');
    auVar15[0xe] = -(auStack_198[0xe] == '>');
    auVar15[0xf] = -(auStack_198[0xf] == '0');
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ba3;
    pcVar1 = &cStack_168;
    pcStack_1d0 = (code *)0x128a92;
    bson_decimal128_from_string("12345678901234567e6111",pcVar1);
    pcStack_1d0 = (code *)0x128aa3;
    bson_decimal128_from_string("1e-6176",auStack_1a8);
    uStack_1c0 = 0x5ffe000000000000;
    uStack_1c8 = 0x2bdc545d6b4b87;
    auVar16[0] = -(cStack_168 == -0x79);
    auVar16[1] = -(cStack_167 == 'K');
    auVar16[2] = -(cStack_166 == 'k');
    auVar16[3] = -(cStack_165 == ']');
    auVar16[4] = -(cStack_164 == 'T');
    auVar16[5] = -(cStack_163 == -0x24);
    auVar16[6] = -(cStack_162 == '+');
    auVar16[7] = -(cStack_161 == '\0');
    auVar16[8] = -(cStack_160 == '\0');
    auVar16[9] = -(cStack_15f == '\0');
    auVar16[10] = -(cStack_15e == '\0');
    auVar16[0xb] = -(cStack_15d == '\0');
    auVar16[0xc] = -(cStack_15c == '\0');
    auVar16[0xd] = -(cStack_15b == '\0');
    auVar16[0xe] = -(cStack_15a == -2);
    auVar16[0xf] = -(cStack_159 == '_');
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ba8;
    uStack_1c0 = 0;
    uStack_1c8 = 1;
    auVar17[0] = -(auStack_1a8[0] == '\x01');
    auVar17[1] = -(auStack_1a8[1] == '\0');
    auVar17[2] = -(auStack_1a8[2] == '\0');
    auVar17[3] = -(auStack_1a8[3] == '\0');
    auVar17[4] = -(auStack_1a8[4] == '\0');
    auVar17[5] = -(auStack_1a8[5] == '\0');
    auVar17[6] = -(auStack_1a8[6] == '\0');
    auVar17[7] = -(auStack_1a8[7] == '\0');
    auVar17[8] = -(auStack_1a8[8] == '\0');
    auVar17[9] = -(auStack_1a8[9] == '\0');
    auVar17[10] = -(auStack_1a8[10] == '\0');
    auVar17[0xb] = -(auStack_1a8[0xb] == '\0');
    auVar17[0xc] = -(auStack_1a8[0xc] == '\0');
    auVar17[0xd] = -(auStack_1a8[0xd] == '\0');
    auVar17[0xe] = -(auStack_1a8[0xe] == '\0');
    auVar17[0xf] = -(auStack_1a8[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128bad;
    pcVar1 = &cStack_178;
    pcStack_1d0 = (code *)0x128b1f;
    bson_decimal128_from_string("-100E-10",pcVar1);
    pcStack_1d0 = (code *)0x128b30;
    bson_decimal128_from_string("10.50E8",&cStack_1b8);
    uStack_1c0 = 0xb02c000000000000;
    uStack_1c8 = 100;
    auVar18[0] = -(cStack_178 == 'd');
    auVar18[1] = -(cStack_177 == '\0');
    auVar18[2] = -(cStack_176 == '\0');
    auVar18[3] = -(cStack_175 == '\0');
    auVar18[4] = -(cStack_174 == '\0');
    auVar18[5] = -(cStack_173 == '\0');
    auVar18[6] = -(cStack_172 == '\0');
    auVar18[7] = -(cStack_171 == '\0');
    auVar18[8] = -(cStack_170 == '\0');
    auVar18[9] = -(cStack_16f == '\0');
    auVar18[10] = -(cStack_16e == '\0');
    auVar18[0xb] = -(cStack_16d == '\0');
    auVar18[0xc] = -(cStack_16c == '\0');
    auVar18[0xd] = -(cStack_16b == '\0');
    auVar18[0xe] = -(cStack_16a == ',');
    auVar18[0xf] = -(cStack_169 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128bb2;
    uStack_1c0 = 0x304c000000000000;
    uStack_1c8 = 0x41a;
    auVar19[0] = -(cStack_1b8 == '\x1a');
    auVar19[1] = -(cStack_1b7 == '\x04');
    auVar19[2] = -(cStack_1b6 == '\0');
    auVar19[3] = -(cStack_1b5 == '\0');
    auVar19[4] = -(cStack_1b4 == '\0');
    auVar19[5] = -(cStack_1b3 == '\0');
    auVar19[6] = -(cStack_1b2 == '\0');
    auVar19[7] = -(cStack_1b1 == '\0');
    auVar19[8] = -(cStack_1b0 == '\0');
    auVar19[9] = -(cStack_1af == '\0');
    auVar19[10] = -(cStack_1ae == '\0');
    auVar19[0xb] = -(cStack_1ad == '\0');
    auVar19[0xc] = -(cStack_1ac == '\0');
    auVar19[0xd] = -(cStack_1ab == '\0');
    auVar19[0xe] = -(cStack_1aa == 'L');
    auVar19[0xf] = -(cStack_1a9 == '0');
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_1d0 = (code *)0x128b9e;
    test_decimal128_from_string__scientific_cold_1();
LAB_00128b9e:
    pcStack_1d0 = (code *)0x128ba3;
    test_decimal128_from_string__scientific_cold_2();
LAB_00128ba3:
    pcStack_1d0 = (code *)0x128ba8;
    test_decimal128_from_string__scientific_cold_3();
LAB_00128ba8:
    pcStack_1d0 = (code *)0x128bad;
    test_decimal128_from_string__scientific_cold_4();
LAB_00128bad:
    pcStack_1d0 = (code *)0x128bb2;
    test_decimal128_from_string__scientific_cold_5();
LAB_00128bb2:
    pcStack_1d0 = (code *)0x128bb7;
    test_decimal128_from_string__scientific_cold_6();
  }
  pcStack_1d0 = test_decimal128_from_string__large;
  test_decimal128_from_string__scientific_cold_7();
  pcStack_238 = (code *)0x128bd5;
  pcStack_1d0 = (code *)pcVar1;
  bson_decimal128_from_string("12345689012345789012345",&cStack_1e0);
  pcStack_238 = (code *)0x128be6;
  bson_decimal128_from_string("1234567890123456789012345678901234",&cStack_1f0);
  pcStack_238 = (code *)0x128bf7;
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&cStack_200);
  pcStack_238 = (code *)0x128c08;
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&cStack_210);
  pcStack_238 = (code *)0x128c19;
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",&cStack_220);
  uStack_228 = 0x304000000000029d;
  uStack_230 = 0x42da3a76f9e0d979;
  auVar20[0] = -(cStack_1e0 == 'y');
  auVar20[1] = -(cStack_1df == -0x27);
  auVar20[2] = -(cStack_1de == -0x20);
  auVar20[3] = -(cStack_1dd == -7);
  auVar20[4] = -(cStack_1dc == 'v');
  auVar20[5] = -(cStack_1db == ':');
  auVar20[6] = -(cStack_1da == -0x26);
  auVar20[7] = -(cStack_1d9 == 'B');
  auVar20[8] = -(cStack_1d8 == -99);
  auVar20[9] = -(cStack_1d7 == '\x02');
  auVar20[10] = -(cStack_1d6 == '\0');
  auVar20[0xb] = -(cStack_1d5 == '\0');
  auVar20[0xc] = -(cStack_1d4 == '\0');
  auVar20[0xd] = -(cStack_1d3 == '\0');
  auVar20[0xe] = -(cStack_1d2 == '@');
  auVar20[0xf] = -(cStack_1d1 == '0');
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_228 = 0x30403cde6fff9732;
    uStack_230 = 0xde825cd07e96aff2;
    auVar21[0] = -(cStack_1f0 == -0xe);
    auVar21[1] = -(cStack_1ef == -0x51);
    auVar21[2] = -(cStack_1ee == -0x6a);
    auVar21[3] = -(cStack_1ed == '~');
    auVar21[4] = -(cStack_1ec == -0x30);
    auVar21[5] = -(cStack_1eb == '\\');
    auVar21[6] = -(cStack_1ea == -0x7e);
    auVar21[7] = -(cStack_1e9 == -0x22);
    auVar21[8] = -(cStack_1e8 == '2');
    auVar21[9] = -(cStack_1e7 == -0x69);
    auVar21[10] = -(cStack_1e6 == -1);
    auVar21[0xb] = -(cStack_1e5 == 'o');
    auVar21[0xc] = -(cStack_1e4 == -0x22);
    auVar21[0xd] = -(cStack_1e3 == '<');
    auVar21[0xe] = -(cStack_1e2 == '@');
    auVar21[0xf] = -(cStack_1e1 == '0');
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d2e;
    uStack_228 = 0x5fffed09bead87c0;
    uStack_230 = 0x378d8e63ffffffff;
    auVar22[0] = -(cStack_200 == -1);
    auVar22[1] = -(cStack_1ff == -1);
    auVar22[2] = -(cStack_1fe == -1);
    auVar22[3] = -(cStack_1fd == -1);
    auVar22[4] = -(cStack_1fc == 'c');
    auVar22[5] = -(cStack_1fb == -0x72);
    auVar22[6] = -(cStack_1fa == -0x73);
    auVar22[7] = -(cStack_1f9 == '7');
    auVar22[8] = -(cStack_1f8 == -0x40);
    auVar22[9] = -(cStack_1f7 == -0x79);
    auVar22[10] = -(cStack_1f6 == -0x53);
    auVar22[0xb] = -(cStack_1f5 == -0x42);
    auVar22[0xc] = -(cStack_1f4 == '\t');
    auVar22[0xd] = -(cStack_1f3 == -0x13);
    auVar22[0xe] = -(cStack_1f2 == -1);
    auVar22[0xf] = -(cStack_1f1 == '_');
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d33;
    uStack_228 = 0x1ed09bead87c0;
    uStack_230 = 0x378d8e63ffffffff;
    auVar23[0] = -(cStack_210 == -1);
    auVar23[1] = -(cStack_20f == -1);
    auVar23[2] = -(cStack_20e == -1);
    auVar23[3] = -(cStack_20d == -1);
    auVar23[4] = -(cStack_20c == 'c');
    auVar23[5] = -(cStack_20b == -0x72);
    auVar23[6] = -(cStack_20a == -0x73);
    auVar23[7] = -(cStack_209 == '7');
    auVar23[8] = -(cStack_208 == -0x40);
    auVar23[9] = -(cStack_207 == -0x79);
    auVar23[10] = -(cStack_206 == -0x53);
    auVar23[0xb] = -(cStack_205 == -0x42);
    auVar23[0xc] = -(cStack_204 == '\t');
    auVar23[0xd] = -(cStack_203 == -0x13);
    auVar23[0xe] = -(cStack_202 == '\x01');
    auVar23[0xf] = -(cStack_201 == '\0');
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d38;
    uStack_228 = 0x3040ffffffffffff;
    uStack_230 = 0xffffffffffffffff;
    auVar24[0] = -(cStack_220 == -1);
    auVar24[1] = -(cStack_21f == -1);
    auVar24[2] = -(cStack_21e == -1);
    auVar24[3] = -(cStack_21d == -1);
    auVar24[4] = -(cStack_21c == -1);
    auVar24[5] = -(cStack_21b == -1);
    auVar24[6] = -(cStack_21a == -1);
    auVar24[7] = -(cStack_219 == -1);
    auVar24[8] = -(cStack_218 == -1);
    auVar24[9] = -(cStack_217 == -1);
    auVar24[10] = -(cStack_216 == -1);
    auVar24[0xb] = -(cStack_215 == -1);
    auVar24[0xc] = -(cStack_214 == -1);
    auVar24[0xd] = -(cStack_213 == -1);
    auVar24[0xe] = -(cStack_212 == '@');
    auVar24[0xf] = -(cStack_211 == '0');
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_238 = (code *)0x128d2e;
    test_decimal128_from_string__large_cold_1();
LAB_00128d2e:
    pcStack_238 = (code *)0x128d33;
    test_decimal128_from_string__large_cold_2();
LAB_00128d33:
    pcStack_238 = (code *)0x128d38;
    test_decimal128_from_string__large_cold_3();
LAB_00128d38:
    pcStack_238 = (code *)0x128d3d;
    test_decimal128_from_string__large_cold_4();
  }
  pcStack_238 = test_decimal128_from_string__exponent_normalization;
  test_decimal128_from_string__large_cold_5();
  pcStack_238 = (code *)0x3040000000000000;
  pcStack_2a0 = (code *)0x128d67;
  pcStack_240 = &cStack_1e0;
  bson_decimal128_from_string("1000000000000000000000000000000000000000",&cStack_250);
  pcStack_2a0 = (code *)0x128d78;
  bson_decimal128_from_string("10000000000000000000000000000000000",&cStack_260);
  pcStack_2a0 = (code *)0x128d89;
  bson_decimal128_from_string("1000000000000000000000000000000000",&cStack_270);
  pcStack_2a0 = (code *)0x128d9a;
  bson_decimal128_from_string
            ("1000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&cStack_280);
  uStack_288 = 0x304c314dc6448d93;
  uStack_290 = 0x38c15b0a00000000;
  auVar25[0] = -(cStack_250 == '\0');
  auVar25[1] = -(cStack_24f == '\0');
  auVar25[2] = -(cStack_24e == '\0');
  auVar25[3] = -(cStack_24d == '\0');
  auVar25[4] = -(cStack_24c == '\n');
  auVar25[5] = -(cStack_24b == '[');
  auVar25[6] = -(cStack_24a == -0x3f);
  auVar25[7] = -(cStack_249 == '8');
  auVar25[8] = -(cStack_248 == -0x6d);
  auVar25[9] = -(cStack_247 == -0x73);
  auVar25[10] = -(cStack_246 == 'D');
  auVar25[0xb] = -(cStack_245 == -0x3a);
  auVar25[0xc] = -(cStack_244 == 'M');
  auVar25[0xd] = -(cStack_243 == '1');
  auVar25[0xe] = -(cStack_242 == 'L');
  auVar25[0xf] = -(cStack_241 == '0');
  if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_288 = 0x3042314dc6448d93;
    uStack_290 = 0x38c15b0a00000000;
    auVar26[0] = -(cStack_260 == '\0');
    auVar26[1] = -(cStack_25f == '\0');
    auVar26[2] = -(cStack_25e == '\0');
    auVar26[3] = -(cStack_25d == '\0');
    auVar26[4] = -(cStack_25c == '\n');
    auVar26[5] = -(cStack_25b == '[');
    auVar26[6] = -(cStack_25a == -0x3f);
    auVar26[7] = -(cStack_259 == '8');
    auVar26[8] = -(cStack_258 == -0x6d);
    auVar26[9] = -(cStack_257 == -0x73);
    auVar26[10] = -(cStack_256 == 'D');
    auVar26[0xb] = -(cStack_255 == -0x3a);
    auVar26[0xc] = -(cStack_254 == 'M');
    auVar26[0xd] = -(cStack_253 == '1');
    auVar26[0xe] = -(cStack_252 == 'B');
    auVar26[0xf] = -(cStack_251 == '0');
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe | (ushort)(auVar26[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128e65;
    uStack_288 = 0x3040314dc6448d93;
    uStack_290 = 0x38c15b0a00000000;
    auVar27[0] = -(cStack_270 == '\0');
    auVar27[1] = -(cStack_26f == '\0');
    auVar27[2] = -(cStack_26e == '\0');
    auVar27[3] = -(cStack_26d == '\0');
    auVar27[4] = -(cStack_26c == '\n');
    auVar27[5] = -(cStack_26b == '[');
    auVar27[6] = -(cStack_26a == -0x3f);
    auVar27[7] = -(cStack_269 == '8');
    auVar27[8] = -(cStack_268 == -0x6d);
    auVar27[9] = -(cStack_267 == -0x73);
    auVar27[10] = -(cStack_266 == 'D');
    auVar27[0xb] = -(cStack_265 == -0x3a);
    auVar27[0xc] = -(cStack_264 == 'M');
    auVar27[0xd] = -(cStack_263 == '1');
    auVar27[0xe] = -(cStack_262 == '@');
    auVar27[0xf] = -(cStack_261 == '0');
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128e6a;
    uStack_288 = 0x37cc314dc6448d93;
    uStack_290 = 0x38c15b0a00000000;
    auVar28[0] = -(cStack_280 == '\0');
    auVar28[1] = -(cStack_27f == '\0');
    auVar28[2] = -(cStack_27e == '\0');
    auVar28[3] = -(cStack_27d == '\0');
    auVar28[4] = -(cStack_27c == '\n');
    auVar28[5] = -(cStack_27b == '[');
    auVar28[6] = -(cStack_27a == -0x3f);
    auVar28[7] = -(cStack_279 == '8');
    auVar28[8] = -(cStack_278 == -0x6d);
    auVar28[9] = -(cStack_277 == -0x73);
    auVar28[10] = -(cStack_276 == 'D');
    auVar28[0xb] = -(cStack_275 == -0x3a);
    auVar28[0xc] = -(cStack_274 == 'M');
    auVar28[0xd] = -(cStack_273 == '1');
    auVar28[0xe] = -(cStack_272 == -0x34);
    auVar28[0xf] = -(cStack_271 == '7');
    if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_2a0 = (code *)0x128e65;
    test_decimal128_from_string__exponent_normalization_cold_1();
LAB_00128e65:
    pcStack_2a0 = (code *)0x128e6a;
    test_decimal128_from_string__exponent_normalization_cold_2();
LAB_00128e6a:
    pcStack_2a0 = (code *)0x128e6f;
    test_decimal128_from_string__exponent_normalization_cold_3();
  }
  pcStack_2a0 = test_decimal128_from_string__zeros;
  test_decimal128_from_string__exponent_normalization_cold_4();
  pcStack_2a0 = (code *)&cStack_250;
  bson_decimal128_from_string("0",&cStack_2b0);
  bson_decimal128_from_string("0e-611",&cStack_2c0);
  bson_decimal128_from_string("0e+6000",&cStack_2d0);
  pcVar1 = "-0e-1";
  bson_decimal128_from_string("-0e-1",&cStack_2e0);
  auVar29[0] = -(cStack_2b0 == '\0');
  auVar29[1] = -(cStack_2af == '\0');
  auVar29[2] = -(cStack_2ae == '\0');
  auVar29[3] = -(cStack_2ad == '\0');
  auVar29[4] = -(cStack_2ac == '\0');
  auVar29[5] = -(cStack_2ab == '\0');
  auVar29[6] = -(cStack_2aa == '\0');
  auVar29[7] = -(cStack_2a9 == '\0');
  auVar29[8] = -(cStack_2a8 == '\0');
  auVar29[9] = -(cStack_2a7 == '\0');
  auVar29[10] = -(cStack_2a6 == '\0');
  auVar29[0xb] = -(cStack_2a5 == '\0');
  auVar29[0xc] = -(cStack_2a4 == '\0');
  auVar29[0xd] = -(cStack_2a3 == '\0');
  auVar29[0xe] = -(cStack_2a2 == '@');
  auVar29[0xf] = -(cStack_2a1 == '0');
  if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf)
      == 0xffff) {
    auVar30[0] = -(cStack_2c0 == '\0');
    auVar30[1] = -(cStack_2bf == '\0');
    auVar30[2] = -(cStack_2be == '\0');
    auVar30[3] = -(cStack_2bd == '\0');
    auVar30[4] = -(cStack_2bc == '\0');
    auVar30[5] = -(cStack_2bb == '\0');
    auVar30[6] = -(cStack_2ba == '\0');
    auVar30[7] = -(cStack_2b9 == '\0');
    auVar30[8] = -(cStack_2b8 == '\0');
    auVar30[9] = -(cStack_2b7 == '\0');
    auVar30[10] = -(cStack_2b6 == '\0');
    auVar30[0xb] = -(cStack_2b5 == '\0');
    auVar30[0xc] = -(cStack_2b4 == '\0');
    auVar30[0xd] = -(cStack_2b3 == '\0');
    auVar30[0xe] = -(cStack_2b2 == 'z');
    auVar30[0xf] = -(cStack_2b1 == '+');
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128f91;
    auVar31[0] = -(cStack_2d0 == '\0');
    auVar31[1] = -(cStack_2cf == '\0');
    auVar31[2] = -(cStack_2ce == '\0');
    auVar31[3] = -(cStack_2cd == '\0');
    auVar31[4] = -(cStack_2cc == '\0');
    auVar31[5] = -(cStack_2cb == '\0');
    auVar31[6] = -(cStack_2ca == '\0');
    auVar31[7] = -(cStack_2c9 == '\0');
    auVar31[8] = -(cStack_2c8 == '\0');
    auVar31[9] = -(cStack_2c7 == '\0');
    auVar31[10] = -(cStack_2c6 == '\0');
    auVar31[0xb] = -(cStack_2c5 == '\0');
    auVar31[0xc] = -(cStack_2c4 == '\0');
    auVar31[0xd] = -(cStack_2c3 == '\0');
    auVar31[0xe] = -(cStack_2c2 == ' ');
    auVar31[0xf] = -(cStack_2c1 == '_');
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf
                ) == 0xffff) {
      auVar32[0] = -(cStack_2e0 == '\0');
      auVar32[1] = -(cStack_2df == '\0');
      auVar32[2] = -(cStack_2de == '\0');
      auVar32[3] = -(cStack_2dd == '\0');
      auVar32[4] = -(cStack_2dc == '\0');
      auVar32[5] = -(cStack_2db == '\0');
      auVar32[6] = -(cStack_2da == '\0');
      auVar32[7] = -(cStack_2d9 == '\0');
      auVar32[8] = -(cStack_2d8 == '\0');
      auVar32[9] = -(cStack_2d7 == '\0');
      auVar32[10] = -(cStack_2d6 == '\0');
      auVar32[0xb] = -(cStack_2d5 == '\0');
      auVar32[0xc] = -(cStack_2d4 == '\0');
      auVar32[0xd] = -(cStack_2d3 == '\0');
      auVar32[0xe] = -(cStack_2d2 == '>');
      auVar32[0xf] = -(cStack_2d1 == -0x50);
      if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
      goto LAB_00128f9b;
    }
  }
  else {
    test_decimal128_from_string__zeros_cold_1();
LAB_00128f91:
    test_decimal128_from_string__zeros_cold_2();
  }
  test_decimal128_from_string__zeros_cold_3();
LAB_00128f9b:
  test_decimal128_from_string__zeros_cold_4();
  TestSuite_Add((TestSuite *)pcVar1,"/bson/error/basic",test_bson_error_basic);
  return;
}

Assistant:

static void
test_decimal128_from_string__invalid_inputs (void)
{
   bson_decimal128_t dec;

   bson_decimal128_from_string (".", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string (".e", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("invalid", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("in", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("i", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("E02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("..1", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1abcede", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24abc", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24abcE+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24E+02abc2d", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("E+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("e+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
}